

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetSourcesCommand.cxx
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
cmTargetSourcesCommand::ConvertToAbsoluteContent
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,cmTargetSourcesCommand *this,cmTarget *tgt,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *content,bool isInterfaceContent)

{
  pointer pbVar1;
  bool bVar2;
  __type _Var3;
  PolicyStatus PVar4;
  size_type sVar5;
  string *psVar6;
  cmMakefile *pcVar7;
  string *__rhs;
  ostream *poVar8;
  PolicyID id;
  pointer in_name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  bool bVar9;
  string local_1e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  absoluteContent;
  ostringstream e;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [22];
  
  PVar4 = cmMakefile::GetPolicyStatus
                    ((this->super_cmTargetPropCommandBase).super_cmCommand.Makefile,CMP0076,false);
  if (PVar4 == OLD) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(__return_storage_ptr__,content);
    return __return_storage_ptr__;
  }
  absoluteContent.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  absoluteContent.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  absoluteContent.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(&absoluteContent,
            (long)(content->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(content->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start >> 5);
  pbVar1 = (content->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  bVar9 = false;
  for (in_name = (content->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start; in_name != pbVar1;
      in_name = in_name + 1) {
    _e = (pointer)local_198;
    local_198[0]._M_local_buf[0] = '\0';
    bVar2 = cmsys::SystemTools::FileIsFullPath(in_name);
    if ((bVar2) || (sVar5 = cmGeneratorExpression::Find(in_name), sVar5 == 0)) {
LAB_001daf62:
      std::__cxx11::string::_M_assign((string *)&e);
    }
    else {
      if (!isInterfaceContent) {
        psVar6 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_
                           ((this->super_cmTargetPropCommandBase).super_cmCommand.Makefile);
        pcVar7 = cmTarget::GetMakefile(tgt);
        __rhs = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(pcVar7);
        _Var3 = std::operator==(psVar6,__rhs);
        if (_Var3) goto LAB_001daf62;
      }
      cmMakefile::GetCurrentSourceDirectory_abi_cxx11_
                ((this->super_cmTargetPropCommandBase).super_cmCommand.Makefile);
      std::__cxx11::string::_M_assign((string *)&e);
      std::__cxx11::string::append((char *)&e);
      bVar9 = true;
      std::__cxx11::string::append((string *)&e);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&absoluteContent,(value_type *)&e);
    std::__cxx11::string::~string((string *)&e);
  }
  if (!bVar9) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(__return_storage_ptr__,content);
LAB_001db135:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&absoluteContent);
    return __return_storage_ptr__;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
  PVar4 = cmMakefile::GetPolicyStatus
                    ((this->super_cmTargetPropCommandBase).super_cmCommand.Makefile,CMP0076,false);
  __x = &absoluteContent;
  switch(PVar4) {
  case OLD:
switchD_001db002_caseD_0:
    __x = content;
  case NEW:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(__return_storage_ptr__,__x);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
    goto LAB_001db135;
  case WARN:
    cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1e8,(cmPolicies *)0x4c,id);
    poVar8 = std::operator<<((ostream *)&e,(string *)&local_1e8);
    std::operator<<(poVar8,"\n");
    break;
  case REQUIRED_IF_USED:
  case REQUIRED_ALWAYS:
    pcVar7 = (this->super_cmTargetPropCommandBase).super_cmCommand.Makefile;
    cmPolicies::GetRequiredPolicyError_abi_cxx11_(&local_1e8,(cmPolicies *)0x4c,id);
    cmMakefile::IssueMessage(pcVar7,FATAL_ERROR,&local_1e8);
    break;
  default:
    goto switchD_001db002_default;
  }
  std::__cxx11::string::~string((string *)&local_1e8);
switchD_001db002_default:
  if (isInterfaceContent) {
    poVar8 = std::operator<<((ostream *)&e,"An interface source of target \"");
    psVar6 = cmTarget::GetName_abi_cxx11_(tgt);
  }
  else {
    poVar8 = std::operator<<((ostream *)&e,
                             "A private source from a directory other than that of target \"");
    psVar6 = cmTarget::GetName_abi_cxx11_(tgt);
  }
  poVar8 = std::operator<<(poVar8,(string *)psVar6);
  std::operator<<(poVar8,"\" has a relative path.");
  pcVar7 = (this->super_cmTargetPropCommandBase).super_cmCommand.Makefile;
  std::__cxx11::stringbuf::str();
  cmMakefile::IssueMessage(pcVar7,AUTHOR_WARNING,&local_1e8);
  std::__cxx11::string::~string((string *)&local_1e8);
  goto switchD_001db002_caseD_0;
}

Assistant:

std::vector<std::string> cmTargetSourcesCommand::ConvertToAbsoluteContent(
  cmTarget* tgt, const std::vector<std::string>& content,
  bool isInterfaceContent)
{
  // Skip conversion in case old behavior has been explicitly requested
  if (this->Makefile->GetPolicyStatus(cmPolicies::CMP0076) ==
      cmPolicies::OLD) {
    return content;
  }

  bool changedPath = false;
  std::vector<std::string> absoluteContent;
  absoluteContent.reserve(content.size());
  for (std::string const& src : content) {
    std::string absoluteSrc;
    if (cmSystemTools::FileIsFullPath(src) ||
        cmGeneratorExpression::Find(src) == 0 ||
        (!isInterfaceContent &&
         (this->Makefile->GetCurrentSourceDirectory() ==
          tgt->GetMakefile()->GetCurrentSourceDirectory()))) {
      absoluteSrc = src;
    } else {
      changedPath = true;
      absoluteSrc = this->Makefile->GetCurrentSourceDirectory();
      absoluteSrc += "/";
      absoluteSrc += src;
    }
    absoluteContent.push_back(absoluteSrc);
  }

  if (!changedPath) {
    return content;
  }

  bool issueMessage = true;
  bool useAbsoluteContent = false;
  std::ostringstream e;
  switch (this->Makefile->GetPolicyStatus(cmPolicies::CMP0076)) {
    case cmPolicies::WARN:
      e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0076) << "\n";
      break;
    case cmPolicies::OLD:
      issueMessage = false;
      break;
    case cmPolicies::REQUIRED_ALWAYS:
    case cmPolicies::REQUIRED_IF_USED:
      this->Makefile->IssueMessage(
        MessageType::FATAL_ERROR,
        cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0076));
      break;
    case cmPolicies::NEW: {
      issueMessage = false;
      useAbsoluteContent = true;
      break;
    }
  }

  if (issueMessage) {
    if (isInterfaceContent) {
      e << "An interface source of target \"" << tgt->GetName()
        << "\" has a relative path.";
    } else {
      e << "A private source from a directory other than that of target \""
        << tgt->GetName() << "\" has a relative path.";
    }
    this->Makefile->IssueMessage(MessageType::AUTHOR_WARNING, e.str());
  }

  return useAbsoluteContent ? absoluteContent : content;
}